

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

Test * ParserTestImplicit::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestImplicit((ParserTestImplicit *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, Implicit) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"build foo: cat bar | baz\n"));

  Edge* edge = state.LookupNode("foo")->in_edge();
  ASSERT_TRUE(edge->is_implicit(1));
}